

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::Concatenate::dim_forward(Concatenate *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  uint uVar2;
  const_reference __src;
  reference __src_00;
  ostream *ds;
  invalid_argument *this_00;
  uint *puVar3;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s;
  Dim c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *__range1;
  uint new_rows;
  Dim *in_stack_fffffffffffffd88;
  Dim *in_stack_fffffffffffffd90;
  ostringstream *this_01;
  Dim *os;
  string local_248 [48];
  ostringstream local_218 [452];
  Dim local_54;
  Dim *local_30;
  __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_> local_28;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_20;
  int local_14;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_14 = 0;
  os = in_RDI;
  local_10 = in_RDX;
  __src = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  memcpy(in_RDI,__src,0x24);
  bVar1 = LooksLikeVector(in_stack_fffffffffffffd88);
  if (bVar1) {
    Dim::resize(in_RDI,1);
  }
  local_20 = local_10;
  local_28._M_current =
       (Dim *)std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::begin(in_stack_fffffffffffffd88);
  local_30 = (Dim *)std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::end
                              ((vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)
                               in_stack_fffffffffffffd88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>
                        *)in_stack_fffffffffffffd88);
    if (!bVar1) {
      Dim::set(in_stack_fffffffffffffd90,(uint)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               (uint)in_stack_fffffffffffffd88);
      return os;
    }
    __src_00 = __gnu_cxx::
               __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>
               ::operator*(&local_28);
    memcpy(&local_54,__src_00,0x24);
    bVar1 = LooksLikeVector(in_stack_fffffffffffffd88);
    if (bVar1) {
      Dim::resize(&local_54,1);
    }
    uVar2 = Dim::operator[](&local_54,0);
    local_14 = uVar2 + local_14;
    Dim::operator[](&local_54,0);
    Dim::set(in_stack_fffffffffffffd90,(uint)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             (uint)in_stack_fffffffffffffd88);
    Dim::single_batch(in_stack_fffffffffffffd90);
    Dim::single_batch(in_stack_fffffffffffffd90);
    bVar1 = cnn::operator!=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if (bVar1) break;
    puVar3 = std::max<unsigned_int>(&in_RDI->bd,&local_54.bd);
    in_RDI->bd = *puVar3;
    __gnu_cxx::
    __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>::
    operator++(&local_28);
  }
  this_01 = local_218;
  std::__cxx11::ostringstream::ostringstream(this_01);
  ds = std::operator<<((ostream *)this_01,"Bad input dimensions in Concatenate: ");
  cnn::operator<<((ostream *)os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)ds);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_248);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr.single_batch() != c.single_batch()) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}